

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<tcu::Matrix<float,_2,_3>_>::doExecute
          (VariableStatement<tcu::Matrix<float,_2,_3>_> *this,EvalContext *ctx)

{
  bool *pbVar1;
  bool *pbVar2;
  Environment *this_00;
  Variable<tcu::Matrix<float,_2,_3>_> *variable;
  Expr<tcu::Matrix<float,_2,_3>_> *pEVar3;
  double dVar4;
  Interval *pIVar5;
  long lVar6;
  long lVar7;
  Interval *pIVar8;
  bool bVar9;
  IVal local_b0;
  
  if (this->m_isDeclaration == true) {
    this_00 = ctx->env;
    variable = (this->m_variable).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
               .m_ptr;
    pEVar3 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_2,_3>_>.
             super_ExprPBase<tcu::Matrix<float,_2,_3>_>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_3>_>_>
             .m_ptr;
    (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(&local_b0,pEVar3,ctx);
    Environment::bind<tcu::Matrix<float,2,3>>(this_00,variable,&local_b0);
  }
  else {
    pEVar3 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_2,_3>_>.
             super_ExprPBase<tcu::Matrix<float,_2,_3>_>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_3>_>_>
             .m_ptr;
    pIVar8 = (Interval *)&local_b0;
    (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(pIVar8,pEVar3,ctx);
    pIVar5 = (Interval *)
             Environment::lookup<tcu::Matrix<float,2,3>>
                       (ctx->env,(this->m_variable).
                                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
                                 .m_ptr);
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        *(undefined8 *)((long)&pIVar5->m_hi + lVar7) = *(undefined8 *)((long)&pIVar8->m_hi + lVar7);
        pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_2>,_3> *)&pIVar8->m_hasNaN)->m_data[0].m_data
                  [0].m_hasNaN + lVar7;
        dVar4 = *(double *)(pbVar1 + 8);
        pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_2>,_3> *)&pIVar5->m_hasNaN)->m_data[0].m_data
                  [0].m_hasNaN + lVar7;
        *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
        *(double *)(pbVar2 + 8) = dVar4;
        lVar7 = lVar7 + 0x30;
      } while (lVar7 != 0x90);
      pIVar5 = pIVar5 + 1;
      pIVar8 = pIVar8 + 1;
      bVar9 = lVar6 == 0;
      lVar6 = lVar6 + 1;
    } while (bVar9);
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}